

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  ConstantVector *pCVar1;
  short sVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  size_t sVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  SPIRType *pSVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  runtime_error *prVar12;
  undefined **ppuVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  char cVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  ushort uVar25;
  bool bVar26;
  bool bVar27;
  string __str;
  string int64_type;
  SPIRType scalar_type;
  SPIRType type;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  uint *local_488;
  size_t local_480;
  uint local_470 [8];
  bool *local_450;
  size_t local_448;
  bool local_438 [40];
  TypedID<(spirv_cross::Types)1> *local_410;
  size_t local_408;
  TypedID<(spirv_cross::Types)1> local_3f8 [8];
  uint *local_3d8;
  size_t local_3d0;
  uint local_3c0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_380;
  ConstantVector *local_348;
  string local_340;
  string local_320;
  CompilerGLSL *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined1 local_2f0 [208];
  uint *local_220;
  size_t local_218;
  uint local_208 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c8;
  undefined1 local_190 [208];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(c->super_IVariant).field_0xc);
  SPIRType::SPIRType((SPIRType *)local_190,pSVar9);
  local_190._28_4_ = 1;
  SPIRType::SPIRType((SPIRType *)local_2f0,(SPIRType *)local_190);
  local_2f0._24_4_ = 1;
  local_2f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2f8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar16 = (this->backend).use_constructor_splatting;
  uVar17 = (c->m).c[0].vecsize;
  uVar24 = (ulong)uVar17;
  bVar26 = 1 < uVar24;
  bVar15 = (bool)((this->backend).can_swizzle_scalar & bVar26 & local_190._16_4_ - Half < 3);
  bVar27 = bVar26;
  if (bVar16 == false) {
    bVar27 = bVar15;
  }
  if (bVar27 == true) {
    if (uVar24 != 0) {
      uVar20 = 0;
      do {
        if ((c->m).c[vector].id[uVar20].id != 0) goto LAB_002d3c50;
        uVar20 = uVar20 + 1;
      } while (uVar24 != uVar20);
    }
    bVar27 = bVar15;
    if (bVar16 != false) {
      bVar27 = 1 < uVar17;
    }
    if (bVar27 == false) {
LAB_002d3c50:
      bVar22 = 0;
      bVar16 = false;
    }
    else {
      bVar22 = bVar16 & bVar26;
LAB_002d3c16:
      pCVar1 = (c->m).c + vector;
      if (local_190._20_4_ == 0x40) {
        lVar21 = 0;
        do {
          if (pCVar1->r[0].u64 != (c->m).c[vector].r[lVar21 + 1].u64) goto LAB_002d3c50;
          lVar21 = lVar21 + 1;
          bVar16 = bVar15;
        } while (uVar24 - 1 != lVar21);
      }
      else {
        lVar21 = 0;
        do {
          if (pCVar1->r[0].u32 != (c->m).c[vector].r[lVar21 + 1].u32) {
            bVar22 = 0;
            bVar15 = false;
          }
          lVar21 = lVar21 + 1;
          bVar16 = bVar15;
        } while (uVar24 - 1 != lVar21);
      }
    }
  }
  else {
    bVar22 = 0;
    bVar16 = false;
    if (bVar15 != false) goto LAB_002d3c16;
  }
  if ((1 < uVar17) && (bVar16 == false)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_320,this,local_190,0);
    plVar10 = (long *)::std::__cxx11::string::append((char *)&local_320);
    ppuVar13 = (undefined **)(plVar10 + 2);
    if ((undefined **)*plVar10 == ppuVar13) {
      local_498._M_allocated_capacity._0_7_ = SUB87(*ppuVar13,0);
      local_498._M_local_buf[7] = (char)((ulong)*ppuVar13 >> 0x38);
      local_498._8_7_ = (undefined7)plVar10[3];
      local_498._M_local_buf[0xf] = (char)((ulong)plVar10[3] >> 0x38);
      local_4a8._0_8_ = local_4a8 + 0x10;
    }
    else {
      local_498._M_allocated_capacity._0_7_ = SUB87(*ppuVar13,0);
      local_498._M_local_buf[7] = (char)((ulong)*ppuVar13 >> 0x38);
      local_4a8._0_8_ = (undefined **)*plVar10;
    }
    local_4a8._8_8_ = plVar10[1];
    *plVar10 = (long)ppuVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
    if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
      operator_delete((void *)local_4a8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
  }
  switch(local_190._16_4_) {
  case 2:
    if (bVar22 != 0) {
LAB_002d57fe:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 3:
    if (bVar22 != 0) {
      cVar19 = *(char *)(c->m).c[vector].r;
      uVar18 = (uint)cVar19;
      uVar17 = -uVar18;
      if (0 < (int)uVar18) {
        uVar17 = uVar18;
      }
      uVar23 = 1;
      if (9 < uVar17) {
        uVar23 = 3 - (uVar17 < 100);
      }
      local_4a8._0_8_ = local_4a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar23 - (cVar19 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_4a8._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar23,uVar17);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
LAB_002d5704:
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) goto LAB_002d570d;
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_4a8,this,local_2f0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        cVar19 = *(char *)((c->m).c[vector].r + uVar24);
        uVar18 = (uint)cVar19;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar23 = 3 - (uVar17 < 100);
        if (uVar17 < 10) {
          uVar23 = 1;
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar23 - (cVar19 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_4a8._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar23,uVar17);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 4:
    if (bVar22 != 0) {
      uVar17 = (c->m).c[vector].r[0].u32;
      bVar22 = (byte)uVar17;
      uVar18 = 1;
      if (9 < bVar22) {
        uVar18 = 3 - (bVar22 < 100);
      }
      local_4a8._0_8_ = local_4a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar18);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_4a8._0_8_,uVar18,uVar17 & 0xff);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      goto LAB_002d5704;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_4a8,this,local_2f0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (c->m).c[vector].r[uVar24].u32;
        bVar22 = (byte)uVar17;
        uVar18 = 3 - (bVar22 < 100);
        if (bVar22 < 10) {
          uVar18 = 1;
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar18);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_4a8._0_8_,uVar18,uVar17 & 0xff);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 5:
    if (bVar22 != 0) {
      sVar2 = *(short *)(c->m).c[vector].r;
      uVar18 = (uint)sVar2;
      uVar17 = -uVar18;
      if (0 < (int)uVar18) {
        uVar17 = uVar18;
      }
      uVar23 = 1;
      if (((9 < uVar17) && (uVar23 = 2, 99 < uVar17)) && (uVar23 = 3, 999 < uVar17)) {
        uVar23 = 5 - (uVar17 < 10000);
      }
      local_4a8._0_8_ = local_4a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar23 - (char)(sVar2 >> 7));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_4a8._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar23,uVar17);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ == local_4a8 + 0x10) goto LAB_002d5806;
LAB_002d570d:
      operator_delete((void *)local_4a8._0_8_);
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      else if (*(this->backend).int16_t_literal_suffix == '\0') {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_4a8,this,local_2f0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        sVar2 = *(short *)((c->m).c[vector].r + uVar24);
        uVar18 = (uint)sVar2;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar23 = 1;
        if (((9 < uVar17) && (uVar23 = 2, 99 < uVar17)) && (uVar23 = 3, 999 < uVar17)) {
          uVar23 = 5 - (uVar17 < 10000);
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar23 - (char)(sVar2 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_4a8._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar23,uVar17);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        sVar2 = *(short *)((c->m).c[vector].r + uVar24);
        uVar18 = (uint)sVar2;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar23 = 1;
        if (((9 < uVar17) && (uVar23 = 2, 99 < uVar17)) && (uVar23 = 3, 999 < uVar17)) {
          uVar23 = 5 - (uVar17 < 10000);
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar23 - (char)(sVar2 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_4a8._0_8_ + (ulong)(uVar18 >> 0x1f)),uVar23,uVar17);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 6:
    if (bVar22 != 0) {
      uVar17 = (c->m).c[vector].r[0].u32;
      cVar19 = '\x01';
      if (9 < uVar17) {
        uVar18 = uVar17;
        cVar7 = '\x04';
        do {
          cVar19 = cVar7;
          if (uVar18 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_002d56c6;
          }
          if (uVar18 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_002d56c6;
          }
          if (uVar18 < 10000) goto LAB_002d56c6;
          bVar27 = 99999 < uVar18;
          uVar18 = uVar18 / 10000;
          cVar7 = cVar19 + '\x04';
        } while (bVar27);
        cVar19 = cVar19 + '\x01';
      }
LAB_002d56c6:
      local_4a8._0_8_ = local_4a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar17);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      goto LAB_002d5704;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      else if (*(this->backend).uint16_t_literal_suffix == '\0') {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_4a8,this,local_2f0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar17 = (c->m).c[vector].r[uVar24].u32;
        uVar23 = uVar17 & 0xffff;
        uVar18 = 1;
        uVar25 = (ushort)uVar17;
        if (((9 < uVar25) && (uVar18 = 2, 99 < uVar25)) && (uVar18 = 3, 999 < uVar23)) {
          uVar18 = 5 - (uVar23 < 10000);
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar18);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4a8._0_8_,uVar18,uVar23);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        uVar17 = (c->m).c[vector].r[uVar24].u32;
        uVar23 = uVar17 & 0xffff;
        uVar18 = 1;
        uVar25 = (ushort)uVar17;
        if (((9 < uVar25) && (uVar18 = 2, 99 < uVar25)) && (uVar18 = 3, 999 < uVar23)) {
          uVar18 = 5 - (uVar23 < 10000);
        }
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,(char)uVar18);
        ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4a8._0_8_,uVar18,uVar23);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 7:
    if (bVar22 != 0) {
      uVar17 = (c->m).c[vector].r[0].u32;
      if (uVar17 == 0x80000000) {
        local_4a8._0_8_ = local_4a8 + 0x10;
        local_498._M_allocated_capacity._0_7_ = 0x38783028746e69;
        local_498._M_local_buf[7] = '0';
        local_498._8_7_ = 0x29303030303030;
        local_4a8._8_8_ = 0xf;
        local_498._M_local_buf[0xf] = '\0';
      }
      else {
        uVar18 = -uVar17;
        if (0 < (int)uVar17) {
          uVar18 = uVar17;
        }
        uVar23 = 1;
        if (9 < uVar18) {
          uVar24 = (ulong)uVar18;
          uVar6 = 4;
          do {
            uVar23 = uVar6;
            uVar8 = (uint)uVar24;
            if (uVar8 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_002d59a5;
            }
            if (uVar8 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_002d59a5;
            }
            if (uVar8 < 10000) goto LAB_002d59a5;
            uVar24 = uVar24 / 10000;
            uVar6 = uVar23 + 4;
          } while (99999 < uVar8);
          uVar23 = uVar23 + 1;
        }
LAB_002d59a5:
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_4a8,(char)uVar23 - (char)((int)uVar17 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)(local_4a8._0_8_ + (ulong)(uVar17 >> 0x1f)),uVar23,uVar18);
      }
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) goto LAB_002d570d;
      goto LAB_002d5806;
    }
    uVar17 = (c->m).c[0].vecsize;
    uVar20 = (ulong)uVar17;
    if (uVar17 == 0) goto LAB_002d582c;
    ppuVar13 = (undefined **)(local_4a8 + 0x10);
    uVar24 = 0;
    local_348 = (c->m).c + vector;
    local_300 = this;
    do {
      if (((uint)uVar20 < 2) || (uVar3 = local_348->id[uVar24].id, uVar3 == 0)) {
        uVar17 = (c->m).c[vector].r[uVar24].u32;
        local_4a8._0_8_ = ppuVar13;
        if (uVar17 == 0x80000000) {
          local_498._8_7_ = 0x29303030303030;
          local_498._M_allocated_capacity._0_7_ = 0x38783028746e69;
          local_498._M_local_buf[7] = '0';
          local_4a8._8_8_ = 0xf;
          local_498._M_local_buf[0xf] = '\0';
        }
        else {
          uVar18 = -uVar17;
          if (0 < (int)uVar17) {
            uVar18 = uVar17;
          }
          uVar23 = 1;
          if (9 < uVar18) {
            uVar20 = (ulong)uVar18;
            uVar6 = 4;
            do {
              uVar23 = uVar6;
              uVar8 = (uint)uVar20;
              if (uVar8 < 100) {
                uVar23 = uVar23 - 2;
                goto LAB_002d4af2;
              }
              if (uVar8 < 1000) {
                uVar23 = uVar23 - 1;
                goto LAB_002d4af2;
              }
              if (uVar8 < 10000) goto LAB_002d4af2;
              uVar20 = uVar20 / 10000;
              uVar6 = uVar23 + 4;
            } while (99999 < uVar8);
            uVar23 = uVar23 + 1;
          }
LAB_002d4af2:
          ::std::__cxx11::string::_M_construct
                    ((ulong)local_4a8,(char)uVar23 - (char)((int)uVar17 >> 0x1f));
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_4a8._0_8_ + (ulong)(uVar17 >> 0x1f)),uVar23,uVar18);
          this = local_300;
        }
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      else {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      if ((undefined **)local_4a8._0_8_ != ppuVar13) {
        operator_delete((void *)local_4a8._0_8_);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
    } while (uVar24 < uVar20);
    break;
  case 8:
    if (bVar22 != 0) {
      uVar17 = (c->m).c[vector].r[0].u32;
      cVar19 = '\x01';
      if (9 < uVar17) {
        uVar18 = uVar17;
        cVar7 = '\x04';
        do {
          cVar19 = cVar7;
          if (uVar18 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_002d5719;
          }
          if (uVar18 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_002d5719;
          }
          if (uVar18 < 10000) goto LAB_002d5719;
          bVar27 = 99999 < uVar18;
          uVar18 = uVar18 / 10000;
          cVar7 = cVar19 + '\x04';
        } while (bVar27);
        cVar19 = cVar19 + '\x01';
      }
LAB_002d5719:
      ppuVar13 = (undefined **)(local_4a8 + 0x10);
      local_4a8._0_8_ = ppuVar13;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar17);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined **)local_4a8._0_8_ != ppuVar13) {
        operator_delete((void *)local_4a8._0_8_);
      }
      uVar17 = 0x81;
      if ((this->options).es != false) {
        uVar17 = 299;
      }
      if ((this->options).version <= uVar17) {
        local_4a8._0_8_ = ppuVar13;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4a8,"GL_EXT_gpu_shader4","");
        pbVar4 = (this->forced_extensions).
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .ptr;
        pbVar11 = ::std::
                  __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (pbVar4,pbVar4 + (this->forced_extensions).
                                             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             .buffer_size,local_4a8);
        sVar5 = (this->forced_extensions).
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size;
        pbVar4 = (this->forced_extensions).
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .ptr;
        if ((undefined **)local_4a8._0_8_ != ppuVar13) {
          operator_delete((void *)local_4a8._0_8_);
        }
        if (pbVar11 == pbVar4 + sVar5) {
          if ((c->m).c[vector].r[0].i32 < 0) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar12,
                       "Tried to convert uint literal into int, but this made the literal negative."
                      );
            goto LAB_002d5a58;
          }
          goto LAB_002d5806;
        }
      }
      if ((this->backend).uint32_t_literal_suffix != false) goto LAB_002d57fe;
      goto LAB_002d5806;
    }
    uVar17 = (c->m).c[0].vecsize;
    uVar20 = (ulong)uVar17;
    if (uVar17 == 0) goto LAB_002d582c;
    uVar24 = 0;
    local_348 = (c->m).c + vector;
    do {
      if (((uint)uVar20 < 2) || (uVar3 = local_348->id[uVar24].id, uVar3 == 0)) {
        uVar17 = (c->m).c[vector].r[uVar24].u32;
        cVar19 = '\x01';
        if (9 < uVar17) {
          uVar18 = uVar17;
          cVar7 = '\x04';
          do {
            cVar19 = cVar7;
            if (uVar18 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_002d5081;
            }
            if (uVar18 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_002d5081;
            }
            if (uVar18 < 10000) goto LAB_002d5081;
            bVar27 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar7 = cVar19 + '\x04';
          } while (bVar27);
          cVar19 = cVar19 + '\x01';
        }
LAB_002d5081:
        local_4a8._0_8_ = local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,cVar19);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar17);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
        uVar17 = 0x81;
        if ((this->options).es != false) {
          uVar17 = 299;
        }
        if ((this->options).version <= uVar17) {
          local_4a8._0_8_ = local_4a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"GL_EXT_gpu_shader4","");
          pbVar4 = (this->forced_extensions).
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr;
          pbVar11 = ::std::
                    __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (pbVar4,pbVar4 + (this->forced_extensions).
                                               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               .buffer_size,(string *)local_4a8);
          sVar5 = (this->forced_extensions).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .buffer_size;
          pbVar4 = (this->forced_extensions).
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr;
          if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
            operator_delete((void *)local_4a8._0_8_);
          }
          if (pbVar11 == pbVar4 + sVar5) {
            if ((c->m).c[vector].r[uVar24].i32 < 0) {
              prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar12,
                         "Tried to convert uint literal into int, but this made the literal negative."
                        );
              *(undefined ***)prVar12 = &PTR__runtime_error_0048ff00;
              __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            goto LAB_002d5192;
          }
        }
        if ((this->backend).uint32_t_literal_suffix == true) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
LAB_002d5192:
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
    } while (uVar24 < uVar20);
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)local_4a8,(SPIRType *)local_190);
    local_498._8_7_ = 0x100000001;
    local_498._M_local_buf[0xf] = '\0';
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_320,this,local_4a8,0);
    if (bVar22 == 0) {
      uVar3 = (c->m).c[0].vecsize;
      if (uVar3 != 0) {
        bVar27 = uVar3 != 1;
        uVar24 = 0;
        do {
          if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
            to_expression_abi_cxx11_(&local_340,this,uVar3,true);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_340._M_dataplus._M_p);
          }
          else {
            convert_to_string(&local_340,(c->m).c[vector].r[uVar24].i64,&local_320,
                              (this->backend).long_long_literal_suffix);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_340._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p);
          }
          uVar24 = uVar24 + 1;
          uVar20 = (ulong)(c->m).c[0].vecsize;
          if (uVar24 < uVar20) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar20 = (ulong)(c->m).c[0].vecsize;
          }
          bVar27 = true;
        } while (uVar24 < uVar20);
      }
    }
    else {
      convert_to_string(&local_340,(c->m).c[vector].r[0].i64,&local_320,
                        (this->backend).long_long_literal_suffix);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_340._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    local_4a8._0_8_ = &PTR__SPIRType_0048ff28;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_380);
    local_3d0 = 0;
    if (local_3d8 != local_3c0) {
      free(local_3d8);
    }
    local_408 = 0;
    if (local_410 != local_3f8) {
      free(local_410);
    }
    local_448 = 0;
    if (local_450 != local_438) {
      free(local_450);
    }
    local_480 = 0;
    if (local_488 != local_470) {
      free(local_488);
    }
LAB_002d5806:
    uVar20 = (ulong)(c->m).c[0].vecsize;
    break;
  case 10:
    if (bVar22 != 0) {
      uVar24 = (c->m).c[vector].r[0].u64;
      cVar19 = '\x01';
      if (9 < uVar24) {
        uVar20 = uVar24;
        cVar7 = '\x04';
        do {
          cVar19 = cVar7;
          if (uVar20 < 100) {
            cVar19 = cVar19 + -2;
            goto LAB_002d565c;
          }
          if (uVar20 < 1000) {
            cVar19 = cVar19 + -1;
            goto LAB_002d565c;
          }
          if (uVar20 < 10000) goto LAB_002d565c;
          bVar27 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          cVar7 = cVar19 + '\x04';
        } while (bVar27);
        cVar19 = cVar19 + '\x01';
      }
LAB_002d565c:
      local_4a8._0_8_ = local_4a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_4a8,cVar19);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar24);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      goto LAB_002d57fe;
    }
    uVar17 = (c->m).c[0].vecsize;
    uVar20 = (ulong)uVar17;
    if (uVar17 == 0) goto LAB_002d582c;
    ppuVar13 = (undefined **)(local_4a8 + 0x10);
    uVar24 = 0;
    local_348 = (c->m).c + vector;
    do {
      if (((uint)uVar20 < 2) || (uVar3 = local_348->id[uVar24].id, uVar3 == 0)) {
        uVar20 = (c->m).c[vector].r[uVar24].u64;
        cVar19 = '\x01';
        if (9 < uVar20) {
          uVar14 = uVar20;
          cVar7 = '\x04';
          do {
            cVar19 = cVar7;
            if (uVar14 < 100) {
              cVar19 = cVar19 + -2;
              goto LAB_002d443f;
            }
            if (uVar14 < 1000) {
              cVar19 = cVar19 + -1;
              goto LAB_002d443f;
            }
            if (uVar14 < 10000) goto LAB_002d443f;
            bVar27 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            cVar7 = cVar19 + '\x04';
          } while (bVar27);
          cVar19 = cVar19 + '\x01';
        }
LAB_002d443f:
        local_4a8._0_8_ = ppuVar13;
        ::std::__cxx11::string::_M_construct((ulong)local_4a8,cVar19);
        ::std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_4a8._0_8_,local_4a8._8_4_,uVar20);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined **)local_4a8._0_8_ != ppuVar13) {
          operator_delete((void *)local_4a8._0_8_);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
        if ((undefined **)local_4a8._0_8_ != ppuVar13) {
          operator_delete((void *)local_4a8._0_8_);
        }
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
    } while (uVar24 < uVar20);
    break;
  default:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar12,"Invalid constant expression basetype.");
LAB_002d5a58:
    *(undefined ***)prVar12 = &PTR__runtime_error_0048ff00;
    __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0xc:
    if ((bVar22 != 0) || (bVar16 != false)) {
      convert_half_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if (bVar16 != false) {
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_4a8,this,pSVar9,1,__return_storage_ptr__);
LAB_002d3f3c:
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_4a8);
        goto LAB_002d5704;
      }
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      else {
        convert_half_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,(uint32_t)uVar24);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 0xd:
    if ((bVar22 != 0) || (bVar16 != false)) {
      convert_float_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if (bVar16 != false) {
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_4a8,this,pSVar9,1,__return_storage_ptr__);
        goto LAB_002d3f3c;
      }
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      else {
        convert_float_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,(uint32_t)uVar24);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
    break;
  case 0xe:
    if ((bVar22 != 0) || (bVar16 != false)) {
      convert_double_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,0);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      if (bVar16 != false) {
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(c->super_IVariant).field_0xc);
        remap_swizzle((string *)local_4a8,this,pSVar9,1,__return_storage_ptr__);
        goto LAB_002d3f3c;
      }
      goto LAB_002d5806;
    }
    uVar3 = (c->m).c[0].vecsize;
    if (uVar3 == 0) goto LAB_002d582c;
    bVar27 = uVar3 != 1;
    uVar24 = 0;
    do {
      if ((bVar27) && (uVar3 = (c->m).c[vector].id[uVar24].id, uVar3 != 0)) {
        to_expression_abi_cxx11_((string *)local_4a8,this,uVar3,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      else {
        convert_double_to_string_abi_cxx11_((string *)local_4a8,this,c,vector,(uint32_t)uVar24);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_4a8._0_8_);
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_);
      }
      uVar24 = uVar24 + 1;
      uVar20 = (ulong)(c->m).c[0].vecsize;
      if (uVar24 < uVar20) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar20 = (ulong)(c->m).c[0].vecsize;
      }
      bVar27 = true;
    } while (uVar24 < uVar20);
  }
  if ((1 < (uint)uVar20) && (bVar16 == false)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_002d582c:
  local_2f0._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1c8);
  local_218 = 0;
  if (local_220 != local_208) {
    free(local_220);
  }
  local_2f0._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_2f0._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_2f0 + 0xb0)) {
    free((void *)local_2f0._152_8_);
  }
  local_2f0._96_8_ = 0;
  if ((undefined1 *)local_2f0._88_8_ != local_2f0 + 0x70) {
    free((void *)local_2f0._88_8_);
  }
  local_2f0._40_8_ = 0;
  if ((undefined1 *)local_2f0._32_8_ != local_2f0 + 0x38) {
    free((void *)local_2f0._32_8_);
  }
  local_190._0_8_ = &PTR__SPIRType_0048ff28;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy() && !has_extension("GL_EXT_gpu_shader4"))
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}